

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void do_test_tlsblock(size_t len_encoded,size_t max_bytes)

{
  byte bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t i_1;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  size_t i;
  size_t sVar10;
  ulong uVar11;
  uint8_t *puVar12;
  undefined1 local_62;
  undefined1 local_61;
  size_t local_60;
  ptls_buffer_t local_58;
  ulong local_38;
  
  local_58.base = "";
  local_58.capacity = 0;
  local_58.off = 0;
  local_58.is_allocated = '\0';
  local_58.align_bits = '\0';
  local_60 = len_encoded;
  iVar4 = ptls_buffer__do_pushv(&local_58,"",len_encoded);
  sVar6 = local_58.off;
  if (iVar4 != 0) {
LAB_00121b95:
    iVar4 = 0;
    uVar8 = 0x88b;
LAB_00121baa:
    _ok(iVar4,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
        uVar8);
    ptls_buffer_dispose(&local_58);
    return;
  }
  sVar10 = 0;
LAB_00121a1d:
  puVar3 = local_58.base;
  sVar2 = local_60;
  if (max_bytes != sVar10) goto code_r0x00121a22;
  uVar5 = local_58.off - sVar6;
  bVar1 = (char)local_60 * '\b';
  if (uVar5 >> (bVar1 & 0x3f) == 0) {
    lVar7 = local_60 * 8;
    for (lVar9 = -local_60; lVar7 = lVar7 + -8, lVar9 != 0; lVar9 = lVar9 + 1) {
      local_58.base[lVar9 + sVar6] = (uint8_t)(uVar5 >> ((byte)lVar7 & 0x3f));
    }
    if (local_60 <= local_58.off) {
      puVar12 = local_58.base + local_58.off;
      uVar5 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)local_58.base[uVar5] | uVar11 << 8;
        uVar5 = uVar5 + 1;
      } while (local_60 != uVar5);
      if (uVar11 <= local_58.off - local_60) {
        _ok((uint)(uVar11 == max_bytes),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x874);
        iVar4 = 1;
        for (sVar6 = 0; max_bytes != sVar6; sVar6 = sVar6 + 1) {
          if ((uint8_t)sVar6 != puVar3[sVar6 + sVar2]) {
            iVar4 = 0;
          }
        }
        _ok(iVar4,"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x87a);
        if ((puVar3 + uVar11 + sVar2 == puVar12) &&
           (iVar4 = ptls_buffer__do_pushv(&local_58,"",local_60), iVar4 == 0)) {
          uVar5 = 0xffffffffffffffff;
          local_38 = local_58.off;
          do {
            uVar5 = uVar5 + 1;
            if (max_bytes < uVar5) {
              if (local_58.off - local_38 >> (bVar1 & 0x3f) == 0) {
                lVar7 = local_60 * 8;
                for (lVar9 = -local_60; lVar7 = lVar7 + -8, lVar9 != 0; lVar9 = lVar9 + 1) {
                  local_58.base[lVar9 + local_38] =
                       (uint8_t)(local_58.off - local_38 >> ((byte)lVar7 & 0x3f));
                }
                iVar4 = 0;
                uVar8 = 0x884;
              }
              else {
                iVar4 = 1;
                uVar8 = 0x889;
              }
              goto LAB_00121baa;
            }
            local_62 = 1;
            iVar4 = ptls_buffer__do_pushv(&local_58,&local_62,1);
          } while (iVar4 == 0);
        }
      }
    }
  }
  goto LAB_00121b95;
code_r0x00121a22:
  local_61 = (undefined1)sVar10;
  iVar4 = ptls_buffer__do_pushv(&local_58,&local_61,1);
  sVar10 = sVar10 + 1;
  if (iVar4 != 0) goto LAB_00121b95;
  goto LAB_00121a1d;
}

Assistant:

static void do_test_tlsblock(size_t len_encoded, size_t max_bytes)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int expect_overflow = 0, ret;

    /* block that fits in */
    ptls_buffer_init(&buf, "", 0);
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes; ++i)
            ptls_buffer_push(&buf, (uint8_t)i);
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, len_encoded, {
        ok(end - src == max_bytes);
        int bytes_eq = 1;
        for (size_t i = 0; i < max_bytes; ++i) {
            if (src[i] != (uint8_t)i)
                bytes_eq = 0;
        }
        ok(bytes_eq);
        src = end;
    });

    /* block that does not fit in */
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes + 1; i++)
            ptls_buffer_push(&buf, 1);
        expect_overflow = 1;
    });
    ok(!"fail");

Exit:
    if (ret != 0) {
        if (expect_overflow) {
            ok(ret == PTLS_ERROR_BLOCK_OVERFLOW);
        } else {
            ok(!"fail");
        }
    }
    ptls_buffer_dispose(&buf);
}